

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  pointer pcVar1;
  pointer puVar2;
  undefined8 uVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  cmValue cVar7;
  string *psVar8;
  cmValue cVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmMakefile *pcVar10;
  WrapQuotes in_R8D;
  string *i;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar11;
  pointer puVar12;
  pointer this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view str;
  string_view str_00;
  string_view str_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includesList;
  string outP;
  string resourceSpecFile;
  string file;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmGeneratedFileStream fout;
  undefined1 local_388 [16];
  undefined1 local_378 [48];
  cmOutputConverter *local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  undefined1 local_330 [40];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_308;
  string local_2f0;
  string local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  undefined1 local_298 [616];
  
  pcVar10 = this->Makefile;
  local_378._24_8_ = this;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_TESTING_ENABLED","");
  bVar4 = cmMakefile::IsOn(pcVar10,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  uVar3 = local_378._24_8_;
  if (!bVar4) {
    return;
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_2b0,*(cmMakefile **)(local_378._24_8_ + 0x70),OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_2d0,*(cmMakefile **)(uVar3 + 0x70));
  local_378._32_8_ = uVar3 + 8;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_298,(cmStateSnapshot *)local_378._32_8_);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_298);
  local_388._8_8_ = (psVar5->_M_dataplus)._M_p;
  local_388._0_8_ = psVar5->_M_string_length;
  local_378._0_8_ = &DAT_00000014;
  local_378._8_8_ = "/CTestTestfile.cmake";
  views._M_len = 2;
  views._M_array = (iterator)local_388;
  cmCatViews_abi_cxx11_(&local_2f0,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_2f0,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# CMake generated Testfile for \n# Source directory: ",0x34);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_388,(cmStateSnapshot *)local_378._32_8_);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_388);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_298,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n# Build directory: ",0x14);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_330,(cmStateSnapshot *)local_378._32_8_);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_330);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "\n# \n# This file includes the relevant testing commands required for \n# testing this directory and lists subdirectories to be tested as well.\n"
             ,0x8d);
  pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"CTEST_RESOURCE_SPEC_FILE","")
  ;
  psVar5 = cmMakefile::GetSafeDefinition(pcVar10,(string *)local_388);
  local_330._0_8_ = local_330 + 0x10;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_330,pcVar1,pcVar1 + psVar5->_M_string_length);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
  }
  if (local_330._8_8_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"set(CTEST_RESOURCE_SPEC_FILE \"",0x1e);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
  }
  pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"TEST_INCLUDE_FILE","");
  cVar7 = cmMakefile::GetProperty(pcVar10,(string *)local_388);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
  }
  if (cVar7.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"include(\"",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,((cVar7.Value)->_M_dataplus)._M_p,
                        (cVar7.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
  }
  pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"TEST_INCLUDE_FILES","");
  cVar7 = cmMakefile::GetProperty(pcVar10,(string *)local_388);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
  }
  if (cVar7.Value != (string *)0x0) {
    arg._M_str = ((cVar7.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar7.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_388,arg,false);
    uVar3 = local_388._8_8_;
    if (local_388._0_8_ != local_388._8_8_) {
      pcVar11 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"include(\"",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,
                            (char *)(pcVar11->Data).
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            (long)(pcVar11->Data).
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
        pcVar11 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                  &(pcVar11->UpPositions).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (pcVar11 != (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)uVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
  }
  pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  puVar12 = (pcVar10->TestGenerators).
            super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pcVar10->TestGenerators).
           super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar2) {
    do {
      cmTestGenerator::Compute
                ((puVar12->_M_t).
                 super___uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_>._M_t.
                 super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
                 super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl,
                 (cmLocalGenerator *)local_378._24_8_);
      cmScriptGenerator::Generate
                (&((puVar12->_M_t).
                   super___uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
                   super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl)->
                  super_cmScriptGenerator,(ostream *)local_298,&local_2d0,&local_2b0);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
    pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  }
  cmMakefile::GetStateSnapshot(pcVar10);
  cmStateSnapshot::GetChildren(&local_308,(cmStateSnapshot *)local_388);
  if (local_308.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_308.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar5 = (string *)(local_378 + 0x28);
    this_00 = local_308.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_388,this_00);
      psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_388);
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      local_378._40_8_ = &local_340;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar5,pcVar1,pcVar1 + psVar8->_M_string_length);
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)local_388,(cmOutputConverter *)local_378._32_8_,psVar5);
      std::__cxx11::string::operator=((string *)psVar5,(string *)local_388);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
      }
      str._M_str = (char *)0x0;
      str._M_len = local_378._40_8_;
      cmOutputConverter::EscapeForCMake_abi_cxx11_((string *)local_388,local_348,str,in_R8D);
      std::__cxx11::string::operator=((string *)psVar5,(string *)local_388);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"subdirs(",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(char *)local_378._40_8_,(long)local_348);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._40_8_ != &local_340) {
        operator_delete((void *)local_378._40_8_,local_340._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_308.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"CMAKE_DIRECTORY_LABELS","");
  cVar7 = cmMakefile::GetDefinition(pcVar10,(string *)local_388);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
  }
  pcVar10 = *(cmMakefile **)(local_378._24_8_ + 0x70);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"LABELS","");
  cVar9 = cmMakefile::GetProperty(pcVar10,(string *)local_388);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
  }
  if (cVar9.Value == (string *)0x0 && cVar7.Value == (string *)0x0) goto LAB_0043d98a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"set_directory_properties(PROPERTIES LABELS ",0x2b);
  if (cVar9.Value == (string *)0x0) {
    if (cVar7.Value != (string *)0x0) goto LAB_0043d92f;
  }
  else {
    str_00._M_str = (char *)0x0;
    str_00._M_len = (size_t)((cVar9.Value)->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              ((string *)local_388,(cmOutputConverter *)(cVar9.Value)->_M_string_length,str_00,
               in_R8D);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,(char *)local_388._0_8_,local_388._8_8_);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
    }
    if (cVar7.Value != (string *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,";",1);
LAB_0043d92f:
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_388,(cmOutputConverter *)(cVar7.Value)->_M_string_length,str_01,
                 in_R8D);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,(char *)local_388._0_8_,local_388._8_8_);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_388._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_378) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,")\n",2);
LAB_0043d98a:
  if (local_308.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_308.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_330._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_330 + 0x10)) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)&(((cmPropertyDefinitionMap *)local_330._16_8_)->Map_)._M_t._M_impl.
                            field_0x1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  std::string file =
    cmStrCat(this->StateSnapshot.GetDirectory().GetCurrentBinary(),
             "/CTestTestfile.cmake");

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for \n"
          "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n"
          "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << "\n"
          "# \n"
          "# This file includes the relevant testing commands "
          "required for \n"
          "# testing this directory and lists subdirectories to "
          "be tested as well.\n";

  std::string resourceSpecFile =
    this->Makefile->GetSafeDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (!resourceSpecFile.empty()) {
    fout << "set(CTEST_RESOURCE_SPEC_FILE \"" << resourceSpecFile << "\")\n";
  }

  cmValue testIncludeFile = this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << *testIncludeFile << "\")\n";
  }

  cmValue testIncludeFiles = this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList = cmExpandedList(*testIncludeFiles);
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")\n";
    }
  }

  // Ask each test generator to write its code.
  for (const auto& tester : this->Makefile->GetTestGenerators()) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  using vec_t = std::vector<cmStateSnapshot>;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeRelativeToCurBinDir(outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")\n";
  }

  // Add directory labels property
  cmValue directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  cmValue labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(*labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(*directoryLabels);
    }
    fout << ")\n";
  }
}